

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpComms.cpp
# Opt level: O3

int __thiscall helics::tcp::TcpComms::processIncomingMessage(TcpComms *this,ActionMessage *cmd)

{
  action_t aVar1;
  int iVar2;
  
  aVar1 = cmd->messageAction;
  if ((((aVar1 != cmd_protocol_priority) && (aVar1 != cmd_protocol_big)) && (aVar1 != cmd_protocol))
     || (iVar2 = -1, cmd->messageID != 0x16570bf)) {
    if ((this->super_NetworkCommsInterface).super_CommsInterface.ActionCallback.super__Function_base
        ._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->super_NetworkCommsInterface).super_CommsInterface.ActionCallback._M_invoker)
              ((_Any_data *)&(this->super_NetworkCommsInterface).super_CommsInterface.ActionCallback
               ,cmd);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int TcpComms::processIncomingMessage(ActionMessage&& cmd)
{
    if (isProtocolCommand(cmd)) {
        switch (cmd.messageID) {
            case CLOSE_RECEIVER:
                return (-1);
            default:
                break;
        }
    }
    ActionCallback(std::move(cmd));
    return 0;
}